

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O0

char out_parse_entity(char *outbuf,size_t outbuf_size,char **sp,size_t *slenp)

{
  undefined8 uVar1;
  long lVar2;
  byte *pbVar3;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  ushort **ppuVar7;
  char *pcVar8;
  size_t sVar9;
  long *in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  undefined1 *in_RDI;
  bool bVar10;
  size_t copylen;
  int skipcnt;
  int diff;
  uint val;
  char c;
  size_t cur;
  size_t hi;
  size_t lo;
  amp_tbl_t *ampptr;
  size_t orig_slen;
  char *orig_s;
  char *dst;
  char ampbuf [10];
  char *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff54;
  size_t local_88;
  int local_80;
  byte local_71;
  char *local_68;
  char *local_60;
  amp_tbl_t *local_58;
  byte *local_40;
  byte local_32 [9];
  byte bStack_29;
  long *local_28;
  undefined8 *local_20;
  long local_18;
  undefined1 *local_10;
  
  uVar1 = *in_RDX;
  lVar2 = *in_RCX;
  if (*in_RCX == 0) {
    local_71 = 0;
  }
  else {
    *in_RCX = *in_RCX + -1;
    pbVar3 = (byte *)*in_RDX;
    *in_RDX = pbVar3 + 1;
    local_71 = *pbVar3;
  }
  local_28 = in_RCX;
  local_20 = in_RDX;
  if (local_71 == 0x23) {
    if (*in_RCX == 0) {
      local_71 = 0;
    }
    else {
      *in_RCX = *in_RCX + -1;
      pbVar3 = (byte *)*in_RDX;
      *in_RDX = pbVar3 + 1;
      local_71 = *pbVar3;
    }
    if ((local_71 == 0x78) || (local_71 == 0x58)) {
      if (*in_RCX == 0) {
        local_71 = 0;
      }
      else {
        *in_RCX = *in_RCX + -1;
        pbVar3 = (byte *)*in_RDX;
        *in_RDX = pbVar3 + 1;
        local_71 = *pbVar3;
      }
      while (ppuVar7 = __ctype_b_loc(), ((*ppuVar7)[(int)(uint)local_71] & 0x1000) != 0) {
        if (local_71 < 0x80) {
          __ctype_b_loc();
        }
        if (*local_28 == 0) {
          local_71 = 0;
        }
        else {
          *local_28 = *local_28 + -1;
          pbVar3 = (byte *)*local_20;
          *local_20 = pbVar3 + 1;
          local_71 = *pbVar3;
        }
      }
    }
    else {
      while( true ) {
        bVar10 = false;
        if (local_71 < 0x80) {
          ppuVar7 = __ctype_b_loc();
          bVar10 = ((*ppuVar7)[(int)(uint)local_71] & 0x800) != 0;
        }
        if (!bVar10) break;
        if (*local_28 == 0) {
          local_71 = 0;
        }
        else {
          *local_28 = *local_28 + -1;
          pbVar3 = (byte *)*local_20;
          *local_20 = pbVar3 + 1;
          local_71 = *pbVar3;
        }
      }
    }
    if (local_71 == 0x3b) {
      if (*local_28 == 0) {
        local_71 = 0;
      }
      else {
        *local_28 = *local_28 + -1;
        pbVar3 = (byte *)*local_20;
        *local_20 = pbVar3 + 1;
        local_71 = *pbVar3;
      }
    }
    os_xlat_html4(in_stack_ffffffffffffff54,in_stack_ffffffffffffff48,
                  (size_t)in_stack_ffffffffffffff40);
    return local_71;
  }
  local_40 = local_32;
  local_18 = in_RSI;
  local_10 = in_RDI;
  do {
    bVar10 = false;
    if (local_71 != 0) {
      if ((local_71 < 0x80) &&
         (ppuVar7 = __ctype_b_loc(), ((*ppuVar7)[(int)(uint)local_71] & 0x800) != 0)) {
LAB_00280969:
        bVar10 = local_40 < &bStack_29;
      }
      else {
        bVar10 = false;
        if (local_71 < 0x80) {
          ppuVar7 = __ctype_b_loc();
          bVar10 = false;
          if (((*ppuVar7)[(int)(uint)local_71] & 0x400) != 0) goto LAB_00280969;
        }
      }
    }
    if (!bVar10) break;
    *local_40 = local_71;
    if (*local_28 == 0) {
      in_stack_ffffffffffffff54 = 0;
    }
    else {
      *local_28 = *local_28 + -1;
      pcVar4 = (char *)*local_20;
      *local_20 = pcVar4 + 1;
      in_stack_ffffffffffffff54 = (uint)*pcVar4;
    }
    local_71 = (byte)in_stack_ffffffffffffff54;
    local_40 = local_40 + 1;
  } while( true );
  *local_40 = 0;
  local_60 = (char *)0x0;
  local_68 = (char *)0x131;
  pcVar4 = local_68;
  pcVar5 = local_60;
LAB_00280a22:
  do {
    local_60 = pcVar5;
    local_68 = pcVar4;
    if ((local_68 < local_60) || ((char *)0x131 < local_60)) {
      local_58 = (amp_tbl_t *)0x0;
LAB_00280b36:
      if (local_71 == 0x3b) {
        if (*local_28 == 0) {
          local_71 = 0;
        }
        else {
          *local_28 = *local_28 + -1;
          pbVar3 = (byte *)*local_20;
          *local_20 = pbVar3 + 1;
          local_71 = *pbVar3;
        }
      }
      else if (local_58 != (amp_tbl_t *)0x0) {
        sVar9 = strlen(local_58->cname);
        *local_20 = uVar1;
        *local_28 = lVar2;
        for (local_80 = (int)sVar9; local_80 != 0; local_80 = local_80 + -1) {
          if (*local_28 == 0) {
            local_71 = 0;
          }
          else {
            *local_28 = *local_28 + -1;
            pbVar3 = (byte *)*local_20;
            *local_20 = pbVar3 + 1;
            local_71 = *pbVar3;
          }
        }
      }
      if (local_58 == (amp_tbl_t *)0x0) {
        *local_20 = uVar1;
        *local_28 = lVar2;
        if (*local_28 == 0) {
          local_71 = 0;
        }
        else {
          *local_28 = *local_28 + -1;
          pbVar3 = (byte *)*local_20;
          *local_20 = pbVar3 + 1;
          local_71 = *pbVar3;
        }
        *local_10 = 0x26;
        local_10[1] = 0;
      }
      else if (local_58->expan == (char *)0x0) {
        os_xlat_html4(in_stack_ffffffffffffff54,in_stack_ffffffffffffff48,
                      (size_t)in_stack_ffffffffffffff40);
      }
      else {
        local_88 = strlen(local_58->expan);
        if (local_18 - 1U < local_88) {
          local_88 = local_18 - 1;
        }
        memcpy(local_10,local_58->expan,local_88);
        local_10[local_88] = 0;
      }
      return local_71;
    }
    pcVar8 = local_60 + ((ulong)((long)local_68 - (long)local_60) >> 1);
    local_58 = amp_tbl + (long)pcVar8;
    iVar6 = strcmp(local_58->cname,(char *)local_32);
    if (iVar6 == 0) goto LAB_00280b36;
    if (0 < iVar6) {
      if ((pcVar8 == local_68) && (pcVar8 == (char *)0x0)) {
        local_58 = (amp_tbl_t *)0x0;
        goto LAB_00280b36;
      }
      in_stack_ffffffffffffff48 = pcVar8;
      pcVar4 = pcVar8;
      pcVar5 = local_60;
      if (pcVar8 == local_68) {
        in_stack_ffffffffffffff48 = local_68 + -1;
        pcVar4 = local_68 + -1;
      }
      goto LAB_00280a22;
    }
    in_stack_ffffffffffffff40 = pcVar8;
    pcVar4 = local_68;
    pcVar5 = pcVar8;
    if (pcVar8 == local_60) {
      in_stack_ffffffffffffff40 = local_60 + 1;
      pcVar5 = local_60 + 1;
    }
  } while( true );
}

Assistant:

static char out_parse_entity(char *outbuf, size_t outbuf_size,
                             char **sp, size_t *slenp)
{
    char  ampbuf[10];
    char *dst;
    char *orig_s;
    size_t orig_slen;
    const struct amp_tbl_t *ampptr;
    size_t lo, hi, cur;
    char  c;

    /* 
     *   remember where the part after the '&' begins, so we can come back
     *   here later if necessary 
     */
    orig_s = *sp;
    orig_slen = *slenp;

    /* get the character after the ampersand */
    c = nextout(sp, slenp);

    /* if it's numeric, parse the number */
    if (c == '#')
    {
        uint val;
        
        /* skip the '#' */
        c = nextout(sp, slenp);

        /* check for hex */
        if (c == 'x' || c == 'X')
        {
            /* skip the 'x' */
            c = nextout(sp, slenp);

            /* read the hex number */
            for (val = 0 ; isxdigit((uchar)c) ; c = nextout(sp, slenp))
            {
                /* accumulate the current digit into the value */
                val *= 16;
                if (outisdg(c))
                    val += c - '0';
                else if (c >= 'a' && c <= 'f')
                    val += c - 'a' + 10;
                else
                    val += c - 'A' + 10;
            }
        }
        else
        {
            /* read the number */
            for (val = 0 ; outisdg(c) ; c = nextout(sp, slenp))
            {
                /* accumulate the current digit into the value */
                val *= 10;
                val += c - '0';
            }
        }
        
        /* if we found a ';' at the end, skip it */
        if (c == ';')
            c = nextout(sp, slenp);
        
        /* translate the character into the output buffer */
        os_xlat_html4(val, outbuf, outbuf_size);
        
        /* we're done with this character */
        return c;
    }

    /*
     *   Parse the sequence after the '&'.  Parse up to the closing
     *   semicolon, or any non-alphanumeric, or until we fill up the buffer.
     */
    for (dst = ampbuf ;
         c != '\0' && (outisdg(c) || outisal(c))
             && dst < ampbuf + sizeof(ampbuf) - 1 ;
         *dst++ = c, c = nextout(sp, slenp)) ;
    
    /* null-terminate the name */
    *dst = '\0';
    
    /* do a binary search for the name */
    lo = 0;
    hi = sizeof(amp_tbl)/sizeof(amp_tbl[0]) - 1;
    for (;;)
    {
        int diff;
        
        /* if we've converged, look no further */
        if (lo > hi || lo >= sizeof(amp_tbl)/sizeof(amp_tbl[0]))
        {
            ampptr = 0;
            break;
        }
        
        /* split the difference */
        cur = lo + (hi - lo)/2;
        ampptr = &amp_tbl[cur];
        
        /* see where we are relative to the target item */
        diff = strcmp(ampptr->cname, ampbuf);
        if (diff == 0)
        {
            /* this is it */
            break;
        }
        else if (diff > 0)
        {
            /* make sure we don't go off the end */
            if (cur == hi && cur == 0)
            {
                /* we've failed to find it */
                ampptr = 0;
                break;
            }
            
            /* this one is too high - check the lower half */
            hi = (cur == hi ? hi - 1 : cur);
        }
        else
        {
            /* this one is too low - check the upper half */
            lo = (cur == lo ? lo + 1 : cur);
        }
    }
    
    /* skip to the appropriate next character */
    if (c == ';')
    {
        /* name ended with semicolon - skip the semicolon */
        c = nextout(sp, slenp);
    }
    else if (ampptr != 0)
    {
        int skipcnt;
        
        /* found the name - skip its exact length */
        skipcnt = strlen(ampptr->cname);
        for (*sp = orig_s, *slenp = orig_slen ; skipcnt != 0 ;
             c = nextout(sp, slenp), --skipcnt) ;
    }
    
    /* if we found the entry, write out the character */
    if (ampptr != 0)
    {
        /* 
         *   if this one has an external mapping table entry, use the mapping
         *   table entry; otherwise, use the default OS routine mapping 
         */
        if (ampptr->expan != 0)
        {
            /* 
             *   we have an explicit expansion from the mapping table file -
             *   use it 
             */
            size_t copylen = strlen(ampptr->expan);
            if (copylen > outbuf_size - 1)
                copylen = outbuf_size - 1;

            memcpy(outbuf, ampptr->expan, copylen);
            outbuf[copylen] = '\0';
        }
        else
        {
            /* 
             *   there's no mapping table expansion - use the default OS code
             *   expansion 
             */
            os_xlat_html4(ampptr->html_cval, outbuf, outbuf_size);
        }
    }
    else
    {
        /* 
         *   didn't find it - output the '&' literally, then back up and
         *   output the entire sequence following 
         */
        *sp = orig_s;
        *slenp = orig_slen;
        c = nextout(sp, slenp);

        /* fill in the '&' return value */
        outbuf[0] = '&';
        outbuf[1] = '\0';
    }

    /* return the next character */
    return c;
}